

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O3

result_type_conflict3 * __thiscall
trng::pareto_dist<long_double>::icdf
          (result_type_conflict3 *__return_storage_ptr__,pareto_dist<long_double> *this,
          result_type_conflict3 x)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined8 in_RAX;
  result_type_conflict3 *prVar3;
  
  lVar2 = (longdouble)0;
  prVar3 = (result_type_conflict3 *)CONCAT71((int7)((ulong)in_RAX >> 8),lVar2 < x._0_10_);
  lVar1 = (longdouble)1;
  if (lVar2 < x._0_10_ && x._0_10_ < lVar1) {
    if ((x._0_10_ != lVar2) || (NAN(x._0_10_) || NAN(lVar2))) {
      if ((x._0_10_ != lVar1) || (NAN(x._0_10_) || NAN(lVar1))) {
        prVar3 = (result_type_conflict3 *)powl();
      }
    }
  }
  else {
    prVar3 = (result_type_conflict3 *)__errno_location();
    *(int *)prVar3 = 0x21;
  }
  return prVar3;
}

Assistant:

result_type icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return (math::pow((1 - x), -1 / P.gamma()) - 1) * P.theta();
    }